

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

uint64_t __thiscall
FIX::double_conversion::ReadUInt64
          (double_conversion *this,Vector<const_char> buffer,int from,int digits_to_read)

{
  byte *pbVar1;
  uint64_t uVar2;
  int iVar3;
  int index;
  Vector<const_char> buffer_local;
  
  index = buffer.length_;
  buffer_local.length_ = (int)buffer.start_;
  iVar3 = from + index;
  uVar2 = 0;
  buffer_local.start_ = (char *)this;
  while( true ) {
    if (iVar3 <= index) {
      return uVar2;
    }
    pbVar1 = (byte *)Vector<const_char>::operator[](&buffer_local,index);
    if (9 < (byte)(*pbVar1 - 0x30)) break;
    uVar2 = (ulong)(*pbVar1 & 0xf) + uVar2 * 10;
    index = index + 1;
  }
  __assert_fail("0 <= digit && digit <= 9",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                ,0x5f,"uint64_t FIX::double_conversion::ReadUInt64(Vector<const char>, int, int)");
}

Assistant:

static uint64_t ReadUInt64(Vector<const char> buffer,
                           int from,
                           int digits_to_read) {
  uint64_t result = 0;
  for (int i = from; i < from + digits_to_read; ++i) {
    int digit = buffer[i] - '0';
    ASSERT(0 <= digit && digit <= 9);
    result = result * 10 + digit;
  }
  return result;
}